

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O0

void re_note_group(re_context *ctx,re_group_register *regs,re_state_id id,char *p)

{
  int iVar1;
  int group_index;
  char *p_local;
  re_state_id id_local;
  re_group_register *regs_local;
  re_context *ctx_local;
  
  if (((id != -1) && ((ctx->tuple_arr[id].flags & 6) != 0)) &&
     (iVar1 = (int)ctx->tuple_arr[id].ch, iVar1 < 10)) {
    if ((ctx->tuple_arr[id].flags & 2) == 0) {
      regs[iVar1].end_ofs = p;
    }
    else {
      regs[iVar1].start_ofs = p;
    }
  }
  return;
}

Assistant:

static void re_note_group(re_context *ctx, re_group_register *regs,
                          re_state_id id, const char *p)
{
    int group_index;

    /*
     *   Check to see if this is a valid state and it's a group marker -
     *   if not, there's nothing to do 
     */
    if (id == RE_STATE_INVALID
        || !(ctx->tuple_arr[id].flags
             & (RE_STATE_GROUP_BEGIN | RE_STATE_GROUP_END))
        || (group_index = (int)ctx->tuple_arr[id].ch) >= RE_GROUP_REG_CNT)
        return;

    /*
     *   It's a valid group marker - note the appropriate register value 
     */
    if ((ctx->tuple_arr[id].flags & RE_STATE_GROUP_BEGIN) != 0)
        regs[group_index].start_ofs = p;
    else
        regs[group_index].end_ofs = p;
}